

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::~LocationRecorder(LocationRecorder *this)

{
  int iVar1;
  Token *token;
  LocationRecorder *this_local;
  
  iVar1 = SourceCodeInfo_Location::span_size(this->location_);
  if (iVar1 < 3) {
    token = io::Tokenizer::previous(this->parser_->input_);
    EndAt(this,token);
  }
  return;
}

Assistant:

Parser::LocationRecorder::~LocationRecorder() {
  if (location_->span_size() <= 2) {
    EndAt(parser_->input_->previous());
  }
}